

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateImplementation
          (ServiceGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->vars_,
                     "$classname$::~$classname$() {}\n\nconst ::google::protobuf::ServiceDescriptor* $classname$::descriptor() {\n  protobuf_AssignDescriptorsOnce();\n  return $classname$_descriptor_;\n}\n\nconst ::google::protobuf::ServiceDescriptor* $classname$::GetDescriptor() {\n  protobuf_AssignDescriptorsOnce();\n  return $classname$_descriptor_;\n}\n\n"
                    );
  GenerateNotImplementedMethods(this,printer);
  GenerateCallMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  io::Printer::Print(printer,&this->vars_,
                     "$classname$_Stub::$classname$_Stub(::google::protobuf::RpcChannel* channel)\n  : channel_(channel), owns_channel_(false) {}\n$classname$_Stub::$classname$_Stub(\n    ::google::protobuf::RpcChannel* channel,\n    ::google::protobuf::Service::ChannelOwnership ownership)\n  : channel_(channel),\n    owns_channel_(ownership == ::google::protobuf::Service::STUB_OWNS_CHANNEL) {}\n$classname$_Stub::~$classname$_Stub() {\n  if (owns_channel_) delete channel_;\n}\n\n"
                    );
  GenerateStubMethods(this,printer);
  return;
}

Assistant:

void ServiceGenerator::GenerateImplementation(io::Printer* printer) {
  printer->Print(vars_,
    "$classname$::~$classname$() {}\n"
    "\n"
    "const ::google::protobuf::ServiceDescriptor* $classname$::descriptor() {\n"
    "  protobuf_AssignDescriptorsOnce();\n"
    "  return $classname$_descriptor_;\n"
    "}\n"
    "\n"
    "const ::google::protobuf::ServiceDescriptor* $classname$::GetDescriptor() {\n"
    "  protobuf_AssignDescriptorsOnce();\n"
    "  return $classname$_descriptor_;\n"
    "}\n"
    "\n");

  // Generate methods of the interface.
  GenerateNotImplementedMethods(printer);
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  // Generate stub implementation.
  printer->Print(vars_,
    "$classname$_Stub::$classname$_Stub(::google::protobuf::RpcChannel* channel)\n"
    "  : channel_(channel), owns_channel_(false) {}\n"
    "$classname$_Stub::$classname$_Stub(\n"
    "    ::google::protobuf::RpcChannel* channel,\n"
    "    ::google::protobuf::Service::ChannelOwnership ownership)\n"
    "  : channel_(channel),\n"
    "    owns_channel_(ownership == ::google::protobuf::Service::STUB_OWNS_CHANNEL) {}\n"
    "$classname$_Stub::~$classname$_Stub() {\n"
    "  if (owns_channel_) delete channel_;\n"
    "}\n"
    "\n");

  GenerateStubMethods(printer);
}